

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

int64_t wallet::GetImportTimestamp(UniValue *data,int64_t now)

{
  bool bVar1;
  UniValue *message;
  char *fmt;
  char **args;
  undefined8 uVar2;
  long in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *timestamp;
  UniValue *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  VType in_stack_fffffffffffffec4;
  UniValue *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int code;
  UniValue *this_00;
  long local_a8;
  undefined1 local_8a [130];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (allocator<char> *)in_stack_fffffffffffffef8);
  bVar1 = UniValue::exists((UniValue *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                           ,(string *)in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator((allocator<char> *)(local_8a + 1));
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (allocator<char> *)in_stack_fffffffffffffef8);
    JSONRPCError((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_fffffffffffffef8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_00500409;
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffef8);
  code = (int)((ulong)this >> 0x20);
  message = UniValue::operator[]
                      (in_stack_fffffffffffffec8,
                       (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator((allocator<char> *)local_8a);
  bVar1 = UniValue::isNum(in_stack_fffffffffffffeb8);
  if (bVar1) {
    local_a8 = UniValue::getInt<long>(this_00);
LAB_005003ac:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return local_a8;
    }
  }
  else {
    bVar1 = UniValue::isStr(in_stack_fffffffffffffeb8);
    if (bVar1) {
      UniValue::get_str_abi_cxx11_
                ((UniValue *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffec8,
                              (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
      ;
      local_a8 = in_RSI;
      if (bVar1) goto LAB_005003ac;
    }
    fmt = (char *)__cxa_allocate_exception(0x58);
    UniValue::type(in_stack_fffffffffffffeb8);
    args = (char **)uvTypeName(in_stack_fffffffffffffec4);
    tinyformat::format<char_const*>(fmt,args);
    JSONRPCError(code,(string *)message);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(fmt,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00500409:
  __stack_chk_fail();
}

Assistant:

static int64_t GetImportTimestamp(const UniValue& data, int64_t now)
{
    if (data.exists("timestamp")) {
        const UniValue& timestamp = data["timestamp"];
        if (timestamp.isNum()) {
            return timestamp.getInt<int64_t>();
        } else if (timestamp.isStr() && timestamp.get_str() == "now") {
            return now;
        }
        throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Expected number or \"now\" timestamp value for key. got type %s", uvTypeName(timestamp.type())));
    }
    throw JSONRPCError(RPC_TYPE_ERROR, "Missing required timestamp field for key");
}